

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O1

int check(int classid,vector<paaword,_std::allocator<paaword>_> *tmp_result,int ENOUGH_COVER)

{
  pointer ppVar1;
  int *piVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color tsid;
  double dVar4;
  _Base_ptr p_Var5;
  void *__s;
  _Base_ptr p_Var6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  int iVar10;
  pointer ppVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  paaword paa;
  vector<int,_std::allocator<int>_> local_1b8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1a0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_170;
  paaword local_140;
  paaword local_b8;
  
  lVar12 = (long)data_n;
  uVar9 = 0xffffffffffffffff;
  if (-1 < lVar12) {
    uVar9 = lVar12 * 4;
  }
  __s = operator_new__(uVar9);
  if (0 < lVar12) {
    memset(__s,0,lVar12 * 4);
  }
  ppVar11 = (tmp_result->super__Vector_base<paaword,_std::allocator<paaword>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((tmp_result->super__Vector_base<paaword,_std::allocator<paaword>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppVar11) {
    p_Var3 = &local_1a0._M_impl.super__Rb_tree_header;
    uVar9 = 0;
    do {
      ppVar1 = ppVar11 + uVar9;
      iVar10 = ppVar1->window;
      dVar4 = ppVar1->score;
      std::vector<int,_std::allocator<int>_>::vector(&local_1b8,&ppVar1->vec);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_1a0,&ppVar11[uVar9].cov._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                (&local_170,&ppVar11[uVar9].allcov._M_t);
      dVar13 = -0.99999999;
      if ((_Rb_tree_header *)local_1a0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
        p_Var6 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
        dVar14 = -1.0;
        do {
          tsid = p_Var6[1]._M_color;
          local_b8.score = dVar4;
          local_b8.window = iVar10;
          std::vector<int,_std::allocator<int>_>::vector(&local_b8.vec,&local_1b8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_b8.cov._M_t,&local_1a0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_b8.allcov._M_t,&local_170);
          dVar13 = calculatedis(&local_b8,tsid);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_b8.allcov._M_t);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_b8.cov._M_t);
          if (local_b8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (dVar13 <= dVar14) {
            dVar13 = dVar14;
          }
          piVar2 = (int *)((long)__s + (long)(int)tsid * 4);
          *piVar2 = *piVar2 + 1;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          dVar14 = dVar13;
        } while ((_Rb_tree_header *)p_Var6 != p_Var3);
        dVar13 = dVar13 + 1e-08;
      }
      if (0 < data_n) {
        lVar12 = 0;
        p_Var6 = &p_Var3->_M_header;
        p_Var5 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
              p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < lVar12]) {
            if (lVar12 <= (int)*(size_t *)(p_Var5 + 1)) {
              p_Var6 = p_Var5;
            }
          }
          p_Var8 = p_Var3;
          if (((_Rb_tree_header *)p_Var6 != p_Var3) &&
             (p_Var8 = (_Rb_tree_header *)p_Var6,
             lVar12 < (int)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
            p_Var8 = p_Var3;
          }
          if (p_Var8 == p_Var3) {
            local_140.score = dVar4;
            local_140.window = iVar10;
            std::vector<int,_std::allocator<int>_>::vector(&local_140.vec,&local_1b8);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree(&local_140.cov._M_t,&local_1a0);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree(&local_140.allcov._M_t,&local_170);
            dVar14 = calculatedis(&local_140,(int)lVar12);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_140.allcov._M_t);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_140.cov._M_t);
            if (local_140.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_140.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (dVar14 < dVar13) {
              piVar2 = (int *)((long)__s + lVar12 * 4);
              *piVar2 = *piVar2 + 1;
            }
          }
          lVar12 = lVar12 + 1;
          p_Var6 = &p_Var3->_M_header;
          p_Var5 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent;
        } while (lVar12 < data_n);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_170);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_1a0);
      if (local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar9 = uVar9 + 1;
      ppVar11 = (tmp_result->super__Vector_base<paaword,_std::allocator<paaword>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar7 = ((long)(tmp_result->super__Vector_base<paaword,_std::allocator<paaword>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppVar11 >> 3) * -0xf0f0f0f0f0f0f0f;
    } while (uVar9 <= uVar7 && uVar7 - uVar9 != 0);
  }
  if ((long)data_n < 1) {
    iVar10 = 0;
  }
  else {
    lVar12 = 0;
    iVar10 = 0;
    do {
      if (ENOUGH_COVER <= *(int *)((long)__s + lVar12 * 4)) {
        iVar10 = iVar10 + (uint)(label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar12] != classid);
      }
      lVar12 = lVar12 + 1;
    } while (data_n != lVar12);
  }
  operator_delete__(__s);
  return iVar10;
}

Assistant:

int check(int classid, vector<paaword> tmp_result, int ENOUGH_COVER) {
    int *cnt_cover = new int[data_n];
    for (int i = 0; i < data_n; ++i) {
        cnt_cover[i] = 0;
    }
//    for (paaword paa : tmp_result) {
    for (int i = 0; i < tmp_result.size(); ++i) {
        paaword paa = tmp_result[i];
        double max_dis = -1;
//        for (int cov : paa.cov) {
        for (set<int>::iterator cov_it = paa.cov.begin(); cov_it != paa.cov.end(); ++cov_it) {
            int cov = *cov_it;
            max_dis = max(max_dis, calculatedis(paa, cov));
            ++cnt_cover[cov];
        }
        max_dis += 1e-8;
        for (int i = 0; i < data_n; ++i) {
            if (!paa.cov.count(i)) {
                if (calculatedis(paa, i) < max_dis) {
                    ++cnt_cover[i];
                }
            }
        }
    }
//    printf("wrong cover ts:");
    int cnt_wrong = 0;
    for (int i = 0; i < data_n; ++i) {
        if (cnt_cover[i] >= ENOUGH_COVER && label[i] != classid) {
            ++cnt_wrong;
//            printf("%3d", i);
        }
    }
//    printf("\n");
    delete[] cnt_cover;
    return cnt_wrong;
}